

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

PgHdr1 * pcache1FetchStage2(PCache1 *pCache,uint iKey,int createFlag)

{
  PGroup *pPVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  PgHdr1 **ppPVar6;
  u64 uVar7;
  ulong uVar8;
  u64 n;
  uint uVar9;
  PgHdr1 *pPVar10;
  
  pPVar1 = pCache->pGroup;
  if (createFlag == 1) {
    uVar9 = pCache->nPage - pCache->nRecyclable;
    if (pPVar1->mxPinned <= uVar9) {
      return (PgHdr1 *)0x0;
    }
    if (pCache->n90pct <= uVar9) {
      return (PgHdr1 *)0x0;
    }
    iVar2 = pcache1UnderMemoryPressure(pCache);
    if ((iVar2 != 0) && (pCache->nRecyclable < uVar9)) {
      return (PgHdr1 *)0x0;
    }
  }
  if (pCache->nHash <= pCache->nPage) {
    pcache1ResizeHash(pCache);
  }
  if ((pCache->bPurgeable != 0) && (pPVar10 = (pPVar1->lru).pLruPrev, pPVar10->isAnchor == 0)) {
    if (pCache->nPage + 1 < pCache->nMax) {
      iVar2 = pcache1UnderMemoryPressure(pCache);
      if (iVar2 == 0) goto LAB_001a7d17;
      pPVar10 = (pPVar1->lru).pLruPrev;
    }
    pcache1RemoveFromHash(pPVar10,0);
    pcache1PinPage(pPVar10);
    if (pPVar10->pCache->szAlloc == pCache->szAlloc) {
      pPVar1->nPurgeable = pPVar1->nPurgeable + (pCache->bPurgeable - pPVar10->pCache->bPurgeable);
      goto LAB_001a7da0;
    }
    pcache1FreePage(pPVar10);
  }
LAB_001a7d17:
  pPVar10 = pCache->pFree;
  if (pPVar10 == (PgHdr1 *)0x0) {
    if (((pCache->nPage == 0) && (pcache1_g.nInitPage != 0)) && (2 < pCache->nMax)) {
      if (sqlite3Hooks_0 != (code *)0x0) {
        (*sqlite3Hooks_0)();
      }
      if (pcache1_g.nInitPage < 1) {
        uVar7 = (long)pcache1_g.nInitPage * -0x400;
        lVar5 = (long)pCache->szAlloc;
      }
      else {
        lVar5 = (long)pCache->szAlloc;
        uVar7 = (ulong)(uint)pcache1_g.nInitPage * lVar5;
      }
      n = (ulong)pCache->nMax * lVar5;
      if ((long)uVar7 < (long)n) {
        n = uVar7;
      }
      pvVar4 = sqlite3Malloc(n);
      pCache->pBulk = pvVar4;
      if (sqlite3Hooks_1 != (code *)0x0) {
        (*sqlite3Hooks_1)();
      }
      if (pvVar4 == (void *)0x0) {
        pPVar10 = pCache->pFree;
        if (pPVar10 == (PgHdr1 *)0x0) goto LAB_001a7d39;
      }
      else {
        iVar3 = (*sqlite3Config.m.xSize)(pvVar4);
        iVar2 = pCache->szAlloc;
        uVar8 = (long)iVar3 / (long)iVar2 & 0xffffffff;
        lVar5 = (long)pCache->szPage;
        pPVar10 = pCache->pFree;
        do {
          *(void **)((long)pvVar4 + lVar5) = pvVar4;
          *(long *)((long)pvVar4 + lVar5 + 8) = (long)pvVar4 + lVar5 + 0x38;
          *(undefined4 *)((long)pvVar4 + lVar5 + 0x14) = 1;
          *(PgHdr1 **)((long)pvVar4 + lVar5 + 0x18) = pPVar10;
          *(undefined8 *)((long)pvVar4 + lVar5 + 0x30) = 0;
          pPVar10 = (PgHdr1 *)((long)pvVar4 + lVar5);
          pvVar4 = (void *)((long)pvVar4 + (long)iVar2);
          uVar9 = (int)uVar8 - 1;
          uVar8 = (ulong)uVar9;
        } while (uVar9 != 0);
        pPVar10 = (PgHdr1 *)((long)pvVar4 + (lVar5 - iVar2));
      }
      goto LAB_001a7d20;
    }
LAB_001a7d39:
    if ((createFlag == 1) && (sqlite3Hooks_0 != (code *)0x0)) {
      (*sqlite3Hooks_0)();
    }
    pvVar4 = pcache1Alloc(pCache->szAlloc);
    if ((createFlag == 1) && (sqlite3Hooks_1 != (code *)0x0)) {
      (*sqlite3Hooks_1)();
    }
    if (pvVar4 == (void *)0x0) {
      return (PgHdr1 *)0x0;
    }
    lVar5 = (long)pCache->szPage;
    pPVar10 = (PgHdr1 *)((long)pvVar4 + lVar5);
    *(void **)((long)pvVar4 + lVar5) = pvVar4;
    *(long *)((long)pvVar4 + lVar5 + 8) = (long)pvVar4 + lVar5 + 0x38;
    *(undefined4 *)((long)pvVar4 + lVar5 + 0x14) = 0;
    ppPVar6 = (PgHdr1 **)((long)pvVar4 + lVar5 + 0x30);
  }
  else {
LAB_001a7d20:
    ppPVar6 = &pPVar10->pNext;
    pCache->pFree = pPVar10->pNext;
  }
  *ppPVar6 = (PgHdr1 *)0x0;
  *pCache->pnPurgeable = *pCache->pnPurgeable + 1;
LAB_001a7da0:
  uVar8 = (ulong)iKey % (ulong)pCache->nHash;
  pCache->nPage = pCache->nPage + 1;
  pPVar10->iKey = iKey;
  pPVar10->pNext = pCache->apHash[uVar8];
  pPVar10->pCache = pCache;
  pPVar10->pLruNext = (PgHdr1 *)0x0;
  *(undefined8 *)(pPVar10->page).pExtra = 0;
  pCache->apHash[uVar8] = pPVar10;
  if (pCache->iMaxKey < iKey) {
    pCache->iMaxKey = iKey;
  }
  return pPVar10;
}

Assistant:

static SQLITE_NOINLINE PgHdr1 *pcache1FetchStage2(
  PCache1 *pCache,
  unsigned int iKey,
  int createFlag
){
  unsigned int nPinned;
  PGroup *pGroup = pCache->pGroup;
  PgHdr1 *pPage = 0;

  /* Step 3: Abort if createFlag is 1 but the cache is nearly full */
  assert( pCache->nPage >= pCache->nRecyclable );
  nPinned = pCache->nPage - pCache->nRecyclable;
  assert( pGroup->mxPinned == pGroup->nMaxPage + 10 - pGroup->nMinPage );
  assert( pCache->n90pct == pCache->nMax*9/10 );
  if( createFlag==1 && (
        nPinned>=pGroup->mxPinned
     || nPinned>=pCache->n90pct
     || (pcache1UnderMemoryPressure(pCache) && pCache->nRecyclable<nPinned)
  )){
    return 0;
  }

  if( pCache->nPage>=pCache->nHash ) pcache1ResizeHash(pCache);
  assert( pCache->nHash>0 && pCache->apHash );

  /* Step 4. Try to recycle a page. */
  if( pCache->bPurgeable
   && !pGroup->lru.pLruPrev->isAnchor
   && ((pCache->nPage+1>=pCache->nMax) || pcache1UnderMemoryPressure(pCache))
  ){
    PCache1 *pOther;
    pPage = pGroup->lru.pLruPrev;
    assert( PAGE_IS_UNPINNED(pPage) );
    pcache1RemoveFromHash(pPage, 0);
    pcache1PinPage(pPage);
    pOther = pPage->pCache;
    if( pOther->szAlloc != pCache->szAlloc ){
      pcache1FreePage(pPage);
      pPage = 0;
    }else{
      pGroup->nPurgeable -= (pOther->bPurgeable - pCache->bPurgeable);
    }
  }

  /* Step 5. If a usable page buffer has still not been found,
  ** attempt to allocate a new one.
  */
  if( !pPage ){
    pPage = pcache1AllocPage(pCache, createFlag==1);
  }

  if( pPage ){
    unsigned int h = iKey % pCache->nHash;
    pCache->nPage++;
    pPage->iKey = iKey;
    pPage->pNext = pCache->apHash[h];
    pPage->pCache = pCache;
    pPage->pLruNext = 0;
    /* pPage->pLruPrev = 0;
    ** No need to clear pLruPrev since it is not accessed when pLruNext==0 */
    *(void **)pPage->page.pExtra = 0;
    pCache->apHash[h] = pPage;
    if( iKey>pCache->iMaxKey ){
      pCache->iMaxKey = iKey;
    }
  }
  return pPage;
}